

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmTarget *this_00;
  string *psVar3;
  ostream *poVar4;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  bool bVar5;
  MessageType t;
  ostringstream e;
  string local_1d0;
  cmake *local_1b0;
  undefined1 local_1a8 [376];
  
  this_00 = FindTarget(this,targetName,false);
  if (this_00 == (cmTarget *)0x0) {
    return true;
  }
  local_1b0 = this->CMakeInstance;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  PVar2 = cmTarget::GetPolicyStatus(this_00,CMP0037);
  if (PVar2 - NEW < 3) {
    t = FATAL_ERROR;
    bVar1 = true;
    bVar5 = false;
LAB_0044e491:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The target name \"",0x11);
    psVar3 = cmTarget::GetName_abi_cxx11_(this_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" is reserved ",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(reason->_M_dataplus)._M_p,reason->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"  It may result in undefined behavior.",0x26);
    }
    std::__cxx11::stringbuf::str();
    backtrace = cmTarget::GetBacktrace(this_00);
    cmake::IssueMessage(local_1b0,t,&local_1d0,backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      bVar5 = false;
      goto LAB_0044e565;
    }
  }
  else if (PVar2 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x25,id);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
    bVar5 = true;
    t = AUTHOR_WARNING;
    goto LAB_0044e491;
  }
  bVar5 = true;
LAB_0044e565:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return bVar5;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  return RaiseCMP0037Message(this->GetCMakeInstance(), tgt, reason);
}